

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buf.c
# Opt level: O0

xmlBufPtr xmlBufCreate(void)

{
  int *piVar1;
  uint *puVar2;
  xmlBufferAllocationScheme *pxVar3;
  xmlChar *pxVar4;
  xmlBufPtr ret;
  
  ret = (xmlBufPtr)(*xmlMalloc)(0x40);
  if (ret == (xmlBufPtr)0x0) {
    xmlBufMemoryError((xmlBufPtr)0x0,"creating buffer");
    ret = (xmlBufPtr)0x0;
  }
  else {
    ret->compat_use = 0;
    ret->use = 0;
    ret->error = 0;
    ret->buffer = (xmlBufferPtr)0x0;
    piVar1 = __xmlDefaultBufferSize();
    ret->size = (long)*piVar1;
    puVar2 = (uint *)__xmlDefaultBufferSize();
    ret->compat_size = *puVar2;
    pxVar3 = __xmlBufferAllocScheme();
    ret->alloc = *pxVar3;
    pxVar4 = (xmlChar *)(*xmlMallocAtomic)(ret->size);
    ret->content = pxVar4;
    if (ret->content == (xmlChar *)0x0) {
      xmlBufMemoryError(ret,"creating buffer");
      (*xmlFree)(ret);
      ret = (xmlBufPtr)0x0;
    }
    else {
      *ret->content = '\0';
      ret->contentIO = (xmlChar *)0x0;
    }
  }
  return ret;
}

Assistant:

xmlBufPtr
xmlBufCreate(void) {
    xmlBufPtr ret;

    ret = (xmlBufPtr) xmlMalloc(sizeof(xmlBuf));
    if (ret == NULL) {
	xmlBufMemoryError(NULL, "creating buffer");
        return(NULL);
    }
    ret->compat_use = 0;
    ret->use = 0;
    ret->error = 0;
    ret->buffer = NULL;
    ret->size = xmlDefaultBufferSize;
    ret->compat_size = xmlDefaultBufferSize;
    ret->alloc = xmlBufferAllocScheme;
    ret->content = (xmlChar *) xmlMallocAtomic(ret->size * sizeof(xmlChar));
    if (ret->content == NULL) {
	xmlBufMemoryError(ret, "creating buffer");
	xmlFree(ret);
        return(NULL);
    }
    ret->content[0] = 0;
    ret->contentIO = NULL;
    return(ret);
}